

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_color_mode_copy(LodePNGColorMode *dest,LodePNGColorMode *source)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  size_t __n;
  uint uVar5;
  
  if (dest->palette != (uchar *)0x0) {
    free(dest->palette);
  }
  dest->palette = (uchar *)0x0;
  dest->palettesize = 0;
  uVar5 = source->key_b;
  dest->key_g = source->key_g;
  dest->key_b = uVar5;
  uVar5 = source->bitdepth;
  puVar4 = source->palette;
  sVar1 = source->palettesize;
  uVar2 = source->key_defined;
  uVar3 = source->key_r;
  dest->colortype = source->colortype;
  dest->bitdepth = uVar5;
  dest->palette = puVar4;
  dest->palettesize = sVar1;
  dest->key_defined = uVar2;
  dest->key_r = uVar3;
  uVar5 = 0;
  if (source->palette != (uchar *)0x0) {
    puVar4 = (uchar *)malloc(0x400);
    dest->palette = puVar4;
    if (puVar4 == (uchar *)0x0) {
      uVar5 = 0x53;
      if (source->palettesize == 0) {
        uVar5 = 0;
      }
    }
    else {
      __n = source->palettesize << 2;
      uVar5 = 0;
      if (__n != 0) {
        memcpy(puVar4,source->palette,__n);
      }
    }
  }
  return uVar5;
}

Assistant:

unsigned lodepng_color_mode_copy(LodePNGColorMode* dest, const LodePNGColorMode* source) {
  lodepng_color_mode_cleanup(dest);
  lodepng_memcpy(dest, source, sizeof(LodePNGColorMode));
  if (source->palette) {
    dest->palette = (unsigned char*)lodepng_malloc(1024);
    if (!dest->palette && source->palettesize) return 83; /*alloc fail*/
    lodepng_memcpy(dest->palette, source->palette, source->palettesize * 4);
  }
  return 0;
}